

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_0::deviceFeatures2
          (TestStatus *__return_storage_ptr__,anon_unknown_0 *this,Context *context)

{
  PlatformInterface *vkp;
  TestStatus *pTVar1;
  pointer ppVVar2;
  int iVar3;
  TestError *this_00;
  ulong uVar4;
  RefBase<vk::VkInstance_s_*> local_3c8;
  TestStatus *local_3a8;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  VkPhysicalDeviceFeatures2KHR extFeatures;
  InstanceDriver vki;
  VkPhysicalDeviceFeatures coreFeatures;
  
  vkp = *(PlatformInterface **)(this + 8);
  createInstanceWithExtension((Move<vk::VkInstance_s_*> *)&vki,vkp,(char *)context);
  local_3c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)vki.m_vk.enumeratePhysicalDevices;
  local_3c8.m_data.object = (VkInstance_s *)vki.super_InstanceInterface._vptr_InstanceInterface;
  local_3c8.m_data.deleter.m_destroyInstance = vki.m_vk.destroyInstance;
  vki.super_InstanceInterface._vptr_InstanceInterface = (_func_int **)0x0;
  vki.m_vk.destroyInstance = (DestroyInstanceFunc)0x0;
  vki.m_vk.enumeratePhysicalDevices = (EnumeratePhysicalDevicesFunc)0x0;
  ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase((RefBase<vk::VkInstance_s_*> *)&vki);
  ::vk::InstanceDriver::InstanceDriver(&vki,vkp,local_3c8.m_data.object);
  ::vk::enumeratePhysicalDevices(&devices,&vki.super_InstanceInterface,local_3c8.m_data.object);
  uVar4 = 0;
  local_3a8 = __return_storage_ptr__;
  while( true ) {
    ppVVar2 = devices.
              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)devices.
                      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)devices.
                      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&extFeatures,"Querying device features succeeded",
                 (allocator<char> *)&coreFeatures);
      pTVar1 = local_3a8;
      tcu::TestStatus::pass(local_3a8,(string *)&extFeatures);
      std::__cxx11::string::~string((string *)&extFeatures);
      std::_Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
      ~_Vector_base(&devices.
                     super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                   );
      ::vk::InstanceDriver::~InstanceDriver(&vki);
      ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase(&local_3c8);
      return pTVar1;
    }
    memset(&coreFeatures,0xcd,0xdc);
    memset(&extFeatures.features,0xcd,0xdc);
    extFeatures.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR;
    extFeatures.pNext = (void *)0x0;
    ::vk::InstanceDriver::getPhysicalDeviceFeatures(&vki,ppVVar2[uVar4],&coreFeatures);
    ::vk::InstanceDriver::getPhysicalDeviceFeatures2KHR
              (&vki,devices.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar4],&extFeatures);
    if (extFeatures.sType != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR) break;
    if (extFeatures.pNext != (void *)0x0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"extFeatures.pNext == DE_NULL",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                 ,0x8b2);
      goto LAB_004a2fe7;
    }
    iVar3 = bcmp(&coreFeatures,&extFeatures.features,0xdc);
    if (iVar3 != 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,
                 "Mismatch between features reported by vkGetPhysicalDeviceFeatures and vkGetPhysicalDeviceFeatures2KHR"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                 ,0x8b5);
      goto LAB_004a2fe7;
    }
    uVar4 = uVar4 + 1;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,
             "extFeatures.sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
             ,0x8b1);
LAB_004a2fe7:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus deviceFeatures2 (Context& context)
{
	const PlatformInterface&		vkp			= context.getPlatformInterface();
	const Unique<VkInstance>		instance	(createInstanceWithExtension(vkp, "VK_KHR_get_physical_device_properties2"));
	const InstanceDriver			vki			(vkp, *instance);
	const vector<VkPhysicalDevice>	devices		= enumeratePhysicalDevices(vki, *instance);

	for (size_t deviceNdx = 0; deviceNdx < devices.size(); ++deviceNdx)
	{
		VkPhysicalDeviceFeatures		coreFeatures;
		VkPhysicalDeviceFeatures2KHR	extFeatures;

		deMemset(&coreFeatures, 0xcd, sizeof(coreFeatures));
		deMemset(&extFeatures.features, 0xcd, sizeof(extFeatures.features));

		extFeatures.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR;
		extFeatures.pNext = DE_NULL;

		vki.getPhysicalDeviceFeatures(devices[deviceNdx], &coreFeatures);
		vki.getPhysicalDeviceFeatures2KHR(devices[deviceNdx], &extFeatures);

		TCU_CHECK(extFeatures.sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR);
		TCU_CHECK(extFeatures.pNext == DE_NULL);

		if (deMemCmp(&coreFeatures, &extFeatures.features, sizeof(VkPhysicalDeviceFeatures)) != 0)
			TCU_FAIL("Mismatch between features reported by vkGetPhysicalDeviceFeatures and vkGetPhysicalDeviceFeatures2KHR");
	}

	return tcu::TestStatus::pass("Querying device features succeeded");
}